

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Platform.cpp
# Opt level: O0

Platform * createPlatform(void)

{
  deBool dVar1;
  int iVar2;
  X11Platform *this;
  bool bVar3;
  
  do {
    dVar1 = deGetFalse();
    bVar3 = false;
    if (dVar1 == 0) {
      iVar2 = XInitThreads();
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) {
      de::throwRuntimeError
                ((char *)0x0,"XInitThreads() != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11Platform.cpp"
                 ,0x62);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  this = (X11Platform *)operator_new(0x68);
  tcu::x11::X11Platform::X11Platform(this);
  return &this->super_Platform;
}

Assistant:

tcu::Platform* createPlatform (void)
{
	// From man:XinitThreads(3):
	//
	//     The XInitThreads function initializes Xlib support for concurrent
	//     threads.  This function must be the first Xlib function
	//     a multi-threaded program calls, and it must complete before any other
	//     Xlib call is made.
	DE_CHECK_RUNTIME_ERR(XInitThreads() != 0);

	return new tcu::x11::X11Platform();
}